

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_HashTable.h
# Opt level: O0

Iterator __thiscall
axl::sl::
HashTable<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*,_axl::sl::HashDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_axl::sl::EqDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&,_axl::sl::SwitchInfo_*>
::visit(HashTable<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*,_axl::sl::HashDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_axl::sl::EqDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&,_axl::sl::SwitchInfo_*>
        *this,StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *key)

{
  bool bVar1;
  void *pvVar2;
  HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>
  *src;
  size_t sVar3;
  Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>
  *in_RSI;
  HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>
  *in_RDI;
  size_t unaff_retaddr;
  HashTable<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*,_axl::sl::HashDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_axl::sl::EqDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&,_axl::sl::SwitchInfo_*>
  *in_stack_00000008;
  size_t loadFactor;
  Entry *entry;
  bool isEqual;
  Iterator it;
  Bucket *bucket;
  size_t hash;
  bool result;
  size_t bucketCount;
  HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>
  *in_stack_ffffffffffffff58;
  HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>
  *p;
  EqDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>
  *in_stack_ffffffffffffff60;
  Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>
  *src_00;
  ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>_>
  *in_stack_ffffffffffffff78;
  IteratorImpl<axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>
  local_48;
  Rwi local_40;
  AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>
  *local_38;
  ulong local_30;
  undefined1 local_21;
  size_t local_20;
  Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>
  *local_18;
  IteratorImpl<axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
  local_8;
  
  local_18 = in_RSI;
  local_20 = ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
             ::getCount((ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
                         *)&(in_RDI->
                            super_MapEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>
                            ).m_key.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.
                            m_hdr);
  if (local_20 == 0) {
    local_20 = 0x20;
    local_21 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
               ::setCount((Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
                           *)in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58);
    if (!(bool)local_21) {
      Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
      ::Iterator((Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
                  *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      return (Iterator)
             local_8.
             super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
             .m_p;
    }
  }
  local_30 = HashDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>
             ::operator()((HashDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>
                           *)in_stack_ffffffffffffff60,
                          (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
                          in_stack_ffffffffffffff58);
  local_40 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
             ::rwi((Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
                    *)in_stack_ffffffffffffff58);
  local_38 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
             ::Rwi::operator[](&local_40,local_30 % local_20);
  local_48.
  super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>
  .m_p = (IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>
          )ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
           ::getHead((ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
                      *)in_stack_ffffffffffffff58);
  while( true ) {
    pvVar2 = sl::IteratorBase::operator_cast_to_void_((IteratorBase *)&local_48);
    if (pvVar2 == (void *)0x0) {
      src = (HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>
             *)operator_new((size_t)in_stack_ffffffffffffff60,
                            (ZeroInit_t *)in_stack_ffffffffffffff58);
      HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>
      ::HashTableEntry((HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>
                        *)0x113184);
      p = src;
      StringBase<char,_axl::sl::StringDetailsBase<char>_>::operator=
                ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)in_stack_ffffffffffffff60,
                 (StringRef *)src);
      src->m_bucket = local_38;
      ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>_>
      ::insertTail(in_stack_ffffffffffffff78,in_RDI);
      ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
      ::insertTail((ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
                    *)in_stack_ffffffffffffff78,in_RDI);
      sVar3 = getCount((HashTable<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*,_axl::sl::HashDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_axl::sl::EqDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&,_axl::sl::SwitchInfo_*>
                        *)0x1131e5);
      if ((in_RDI->
          super_MapEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>
          ).m_value < (SwitchInfo *)((sVar3 * 100) / local_20)) {
        setBucketCount(in_stack_00000008,unaff_retaddr);
      }
      Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
      ::Iterator((Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
                  *)in_stack_ffffffffffffff60,p);
      return (Iterator)
             local_8.
             super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
             .m_p;
    }
    in_stack_ffffffffffffff60 =
         (EqDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>
          *)((long)&(in_RDI->m_bucketLink).m_next + 1);
    src_00 = local_18;
    IteratorImpl<axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>
    ::operator->(&local_48);
    bVar1 = EqDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>
            ::operator()(in_stack_ffffffffffffff60,
                         (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
                         in_stack_ffffffffffffff58,
                         (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x113128);
    if (bVar1) break;
    IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>
    ::operator++((IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>
                  *)in_stack_ffffffffffffff58,0);
  }
  Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,axl::sl::SwitchInfo*>,axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,axl::sl::SwitchInfo*>,axl::sl::ListLink>>
  ::
  Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,axl::sl::SwitchInfo*>::GetBucketLink>
            ((Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
              *)in_RDI,src_00);
  return (Iterator)
         local_8.
         super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
         .m_p;
}

Assistant:

Iterator
	visit(KeyArg key) {
		size_t bucketCount = m_table.getCount();
		if (!bucketCount) {
			bucketCount = Def_InitialBucketCount;

			bool result = m_table.setCount(bucketCount);
			if (!result)
				return NULL;
		}

		size_t hash = m_hash(key);
		Bucket* bucket = &m_table.rwi()[hash % bucketCount];
		typename Bucket::Iterator it = bucket->getHead();
		for (; it; it++) {
			bool isEqual = m_eq(key, it->m_key);
			if (isEqual)
				return it;
		}

		Entry* entry = new (mem::ZeroInit) Entry;
		entry->m_key = key;
		entry->m_bucket = bucket;
		m_list.insertTail(entry);
		bucket->insertTail(entry);

	#if (AXL_PTR_BITS == 64)
		size_t loadFactor = getCount() * 100 / bucketCount;
	#else
		size_t loadFactor = (size_t)((uint64_t)getCount() * 100 / bucketCount);
	#endif

		if (loadFactor > m_resizeThreshold)
			setBucketCount(bucketCount * 2);

		return entry;
	}